

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanodetplus_pnnx.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  pointer pOVar1;
  undefined8 *puVar2;
  Allocator **ppAVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  ulong uVar6;
  undefined4 uVar10;
  ulong uVar7;
  undefined4 uVar11;
  undefined8 uVar8;
  undefined8 uVar9;
  char *pcVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  int *piVar15;
  bool bVar16;
  size_t *psVar17;
  char cVar18;
  int iVar19;
  int iVar20;
  float *pfVar21;
  long lVar22;
  size_t sVar23;
  vector<Object,_std::allocator<Object>_> *pvVar24;
  uint uVar25;
  ulong uVar26;
  uint uVar27;
  pointer pOVar28;
  int left;
  float fVar29;
  float fVar30;
  int top;
  float fVar32;
  undefined1 auVar31 [16];
  int iVar33;
  int w;
  undefined8 uVar34;
  float fVar35;
  float fVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  int baseLine;
  vector<Object,_std::allocator<Object>_> objects8;
  vector<Object,_std::allocator<Object>_> proposals;
  Extractor ex;
  vector<float,_std::allocator<float>_> areas;
  Mat local_2b8;
  vector<Object,_std::allocator<Object>_> objects;
  float mean_vals [3];
  float norm_vals [3];
  Mat image;
  float local_210;
  float fStack_20c;
  Allocator *local_1f8;
  Net nanodet;
  Mat m;
  undefined8 local_88;
  uchar *local_80;
  
  if (argc == 2) {
    pcVar12 = argv[1];
    std::__cxx11::string::string((string *)&nanodet,pcVar12,(allocator *)&image);
    cv::imread((string *)&m,(int)&nanodet);
    if ((Allocator **)nanodet._vptr_Net != &nanodet.opt.blob_allocator) {
      operator_delete(nanodet._vptr_Net);
    }
    cVar18 = cv::Mat::empty();
    if (cVar18 == '\0') {
      objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      ncnn::Net::Net(&nanodet);
      nanodet.opt.use_vulkan_compute = true;
      iVar19 = ncnn::Net::load_param(&nanodet,"nanodet-plus-m_416.torchscript.ncnn.param");
      if ((iVar19 != 0) ||
         (iVar19 = ncnn::Net::load_model(&nanodet,"nanodet-plus-m_416.torchscript.ncnn.bin"),
         iVar19 != 0)) {
        exit(-1);
      }
      iVar19 = (int)local_88;
      w = (int)((ulong)local_88 >> 0x20);
      if (iVar19 < w) {
        fVar35 = 416.0 / (float)w;
        iVar20 = (int)((float)iVar19 * fVar35);
        iVar33 = 0x1a0;
      }
      else {
        fVar35 = 416.0 / (float)iVar19;
        iVar33 = (int)((float)w * fVar35);
        iVar20 = 0x1a0;
      }
      ncnn::Mat::from_pixels_resize
                ((Mat *)&image,local_80,2,w,iVar19,iVar33,iVar20,(Allocator *)0x0);
      local_2b8.cstep = 0;
      local_2b8.data._0_4_ = 0;
      local_2b8.data._4_4_ = 0;
      local_2b8.refcount._0_4_ = 0;
      local_2b8.refcount._4_4_ = 0;
      local_2b8.elemsize = 0;
      local_2b8.elempack = 0;
      local_2b8.allocator = (Allocator *)0x0;
      local_2b8.dims = 0;
      local_2b8.w = 0;
      local_2b8.h = 0;
      local_2b8.d = 0;
      local_2b8.c = 0;
      ncnn::Option::Option((Option *)&areas);
      iVar33 = ((iVar33 + 0x1f) / 0x20) * 0x20 - iVar33;
      iVar20 = ((iVar20 + 0x1f) / 0x20) * 0x20 - iVar20;
      left = iVar33 / 2;
      top = iVar20 / 2;
      ncnn::copy_make_border
                ((Mat *)&image,&local_2b8,top,iVar20 - top,left,iVar33 - left,0,0.0,(Option *)&areas
                );
      mean_vals[0] = 103.53;
      mean_vals[1] = 116.28;
      mean_vals[2] = 123.675;
      norm_vals[0] = 0.017429;
      norm_vals[1] = 0.017507;
      norm_vals[2] = 0.017125;
      ncnn::Mat::substract_mean_normalize(&local_2b8,mean_vals,norm_vals);
      ncnn::Net::create_extractor((Net *)&ex);
      ncnn::Extractor::input(&ex,"in0",&local_2b8);
      proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._0_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._4_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      pvVar24 = (vector<Object,_std::allocator<Object>_> *)0x0;
      ncnn::Extractor::extract(&ex,"231",(Mat *)&areas,0);
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      generate_proposals((Mat *)&areas,8,(Mat *)&objects8,0.0,pvVar24);
      std::vector<Object,std::allocator<Object>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<Object*,std::vector<Object,std::allocator<Object>>>>
                ((vector<Object,std::allocator<Object>> *)&proposals,
                 proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_start);
      if (objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      piVar15 = (int *)CONCAT44(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._4_4_,
                                areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._0_4_);
      if (piVar15 != (int *)0x0) {
        LOCK();
        *piVar15 = *piVar15 + -1;
        UNLOCK();
        if ((*piVar15 == 0) &&
           (areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0)) {
          free(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start);
        }
      }
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._0_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._4_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      pvVar24 = (vector<Object,_std::allocator<Object>_> *)0x0;
      ncnn::Extractor::extract(&ex,"228",(Mat *)&areas,0);
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      generate_proposals((Mat *)&areas,0x10,(Mat *)&objects8,0.0,pvVar24);
      std::vector<Object,std::allocator<Object>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<Object*,std::vector<Object,std::allocator<Object>>>>
                ((vector<Object,std::allocator<Object>> *)&proposals,
                 proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_start);
      if (objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      piVar15 = (int *)CONCAT44(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._4_4_,
                                areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._0_4_);
      if (piVar15 != (int *)0x0) {
        LOCK();
        *piVar15 = *piVar15 + -1;
        UNLOCK();
        if ((*piVar15 == 0) &&
           (areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0)) {
          free(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start);
        }
      }
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._0_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._4_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      pvVar24 = (vector<Object,_std::allocator<Object>_> *)0x0;
      ncnn::Extractor::extract(&ex,"225",(Mat *)&areas,0);
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      generate_proposals((Mat *)&areas,0x20,(Mat *)&objects8,0.0,pvVar24);
      std::vector<Object,std::allocator<Object>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<Object*,std::vector<Object,std::allocator<Object>>>>
                ((vector<Object,std::allocator<Object>> *)&proposals,
                 proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_start);
      if (objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      piVar15 = (int *)CONCAT44(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._4_4_,
                                areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._0_4_);
      if (piVar15 != (int *)0x0) {
        LOCK();
        *piVar15 = *piVar15 + -1;
        UNLOCK();
        if ((*piVar15 == 0) &&
           (areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0)) {
          free(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start);
        }
      }
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._0_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._4_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      pvVar24 = (vector<Object,_std::allocator<Object>_> *)0x0;
      ncnn::Extractor::extract(&ex,"222",(Mat *)&areas,0);
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      generate_proposals((Mat *)&areas,0x40,(Mat *)&objects8,0.0,pvVar24);
      std::vector<Object,std::allocator<Object>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<Object*,std::vector<Object,std::allocator<Object>>>>
                ((vector<Object,std::allocator<Object>> *)&proposals,
                 proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      if (objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      piVar15 = (int *)CONCAT44(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._4_4_,
                                areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._0_4_);
      if (piVar15 != (int *)0x0) {
        LOCK();
        *piVar15 = *piVar15 + -1;
        UNLOCK();
        if ((*piVar15 == 0) &&
           (areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0)) {
          free(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start);
        }
      }
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._0_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._4_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      if (proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start !=
          proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        qsort_descent_inplace
                  (&proposals,0,
                   (int)((ulong)((long)proposals.super__Vector_base<Object,_std::allocator<Object>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)proposals.super__Vector_base<Object,_std::allocator<Object>_>.
                                      _M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555
                   + -1);
      }
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      uVar27 = (int)((long)proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                           super__Vector_impl_data._M_start >> 3) * -0x55555555;
      std::vector<float,_std::allocator<float>_>::vector
                (&areas,(long)(int)uVar27,(allocator_type *)&baseLine);
      if ((int)uVar27 < 1) {
        baseLine = 0;
      }
      else {
        pfVar21 = &((proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                     super__Vector_impl_data._M_start)->rect).height;
        uVar26 = 0;
        do {
          areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar26] = pfVar21[-1] * *pfVar21;
          uVar26 = uVar26 + 1;
          pfVar21 = pfVar21 + 6;
        } while ((uVar27 & 0x7fffffff) != uVar26);
        baseLine = 0;
        do {
          uVar25 = (uint)((ulong)((long)objects8.super__Vector_base<Object,_std::allocator<Object>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)objects8.super__Vector_base<Object,_std::allocator<Object>_>.
                                       _M_impl.super__Vector_impl_data._M_start) >> 2);
          if ((int)uVar25 < 1) {
LAB_00160bbb:
            if (objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&objects8,
                         (iterator)
                         objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                         super__Vector_impl_data._M_finish,&baseLine);
            }
            else {
              ((objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                super__Vector_impl_data._M_finish)->rect).x = (float)baseLine;
              objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   (pointer)&((objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                               super__Vector_impl_data._M_finish)->rect).y;
            }
          }
          else {
            pOVar28 = proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                      super__Vector_impl_data._M_start + baseLine;
            bVar16 = true;
            uVar26 = 0;
            do {
              fVar36 = (&((objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                           super__Vector_impl_data._M_start)->rect).x)[uVar26];
              if (pOVar28->label ==
                  proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                  super__Vector_impl_data._M_start[(int)fVar36].label) {
                pOVar1 = proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                         super__Vector_impl_data._M_start + (int)fVar36;
                uVar6._0_4_ = (pOVar28->rect).x;
                uVar6._4_4_ = (pOVar28->rect).y;
                auVar40._8_8_ = 0;
                auVar40._0_8_ = uVar6;
                uVar4 = (pOVar28->rect).width;
                uVar10 = (pOVar28->rect).height;
                uVar7._0_4_ = (pOVar1->rect).x;
                uVar7._4_4_ = (pOVar1->rect).y;
                auVar39._8_8_ = 0;
                auVar39._0_8_ = uVar7;
                uVar5 = (pOVar1->rect).width;
                uVar11 = (pOVar1->rect).height;
                auVar31._0_4_ = (float)uVar5 + (float)(undefined4)uVar7;
                auVar31._4_4_ = (float)uVar11 + (float)uVar7._4_4_;
                auVar31._8_8_ = 0;
                auVar40 = maxps(auVar39,auVar40);
                auVar37._0_4_ = (float)uVar4 + (float)(undefined4)uVar6;
                auVar37._4_4_ = (float)uVar10 + (float)uVar6._4_4_;
                auVar37._8_8_ = 0;
                auVar31 = minps(auVar31,auVar37);
                fVar29 = auVar31._0_4_ - auVar40._0_4_;
                fVar32 = auVar31._4_4_ - auVar40._4_4_;
                fVar30 = 0.0;
                if (0.0 < fVar32 && 0.0 < fVar29) {
                  fVar30 = fVar29 * fVar32;
                }
                if (0.5 < fVar30 / ((areas.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                     .super__Vector_impl_data._M_start[baseLine] +
                                    areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                    super__Vector_impl_data._M_start[(int)fVar36]) - fVar30)) {
                  bVar16 = false;
                }
              }
              uVar26 = uVar26 + 1;
            } while ((uVar25 & 0x7fffffff) != uVar26);
            if (bVar16) goto LAB_00160bbb;
          }
          baseLine = baseLine + 1;
        } while (baseLine < (int)uVar27);
      }
      if (areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      uVar27 = (uint)((ulong)((long)objects8.super__Vector_base<Object,_std::allocator<Object>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)objects8.super__Vector_base<Object,_std::allocator<Object>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 2);
      std::vector<Object,_std::allocator<Object>_>::resize(&objects,(long)(int)uVar27);
      if (0 < (int)uVar27) {
        uVar34 = CONCAT44((float)(iVar19 + -1),(float)(w + -1));
        lVar22 = 0;
        uVar26 = 0;
        do {
          fVar36 = (&((objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                       super__Vector_impl_data._M_start)->rect).x)[uVar26];
          uVar8 = *(undefined8 *)
                   &proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                    super__Vector_impl_data._M_start[(int)fVar36].rect.width;
          puVar2 = (undefined8 *)
                   ((long)&((objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                             super__Vector_impl_data._M_start)->rect).x + lVar22);
          *puVar2 = *(undefined8 *)
                     &proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                      super__Vector_impl_data._M_start[(int)fVar36].rect;
          puVar2[1] = uVar8;
          *(undefined8 *)
           ((long)&(objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                    super__Vector_impl_data._M_start)->label + lVar22) =
               *(undefined8 *)
                &proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_start[(int)fVar36].label;
          uVar8 = *(undefined8 *)
                   ((long)&((objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                             super__Vector_impl_data._M_start)->rect).x + lVar22);
          uVar9 = *(undefined8 *)
                   ((long)&((objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                             super__Vector_impl_data._M_start)->rect).width + lVar22);
          fVar36 = (float)uVar8;
          fVar29 = (float)((ulong)uVar8 >> 0x20);
          auVar38._0_4_ = fVar36 - (float)left;
          auVar38._4_4_ = fVar29 - (float)top;
          auVar38._8_8_ = 0;
          auVar13._4_4_ = fVar35;
          auVar13._0_4_ = fVar35;
          auVar13._8_4_ = fVar35;
          auVar13._12_4_ = fVar35;
          auVar31 = divps(auVar38,auVar13);
          auVar41._0_4_ = ((float)uVar9 + fVar36) - (float)left;
          auVar41._4_4_ = ((float)((ulong)uVar9 >> 0x20) + fVar29) - (float)top;
          auVar41._8_8_ = 0;
          auVar14._4_4_ = fVar35;
          auVar14._0_4_ = fVar35;
          auVar14._8_4_ = fVar35;
          auVar14._12_4_ = fVar35;
          auVar40 = divps(auVar41,auVar14);
          auVar42._8_4_ = 0xbf800000;
          auVar42._0_8_ = uVar34;
          auVar42._12_4_ = 0xbf800000;
          auVar31 = minps(auVar42,auVar31);
          auVar31 = maxps(ZEXT816(0),auVar31);
          auVar43._8_4_ = 0xbf800000;
          auVar43._0_8_ = uVar34;
          auVar43._12_4_ = 0xbf800000;
          auVar40 = minps(auVar43,auVar40);
          auVar40 = maxps(ZEXT816(0),auVar40);
          *(long *)((long)&((objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                             super__Vector_impl_data._M_start)->rect).x + lVar22) = auVar31._0_8_;
          *(ulong *)((long)&((objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                              super__Vector_impl_data._M_start)->rect).width + lVar22) =
               CONCAT44(auVar40._4_4_ - auVar31._4_4_,auVar40._0_4_ - auVar31._0_4_);
          uVar26 = uVar26 + 1;
          lVar22 = lVar22 + 0x18;
        } while ((uVar27 & 0x7fffffff) != uVar26);
      }
      if (objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      ncnn::Extractor::~Extractor(&ex);
      piVar15 = (int *)CONCAT44(local_2b8.refcount._4_4_,local_2b8.refcount._0_4_);
      if (piVar15 != (int *)0x0) {
        LOCK();
        *piVar15 = *piVar15 + -1;
        UNLOCK();
        if (*piVar15 == 0) {
          if (local_2b8.allocator == (Allocator *)0x0) {
            if ((void *)CONCAT44(local_2b8.data._4_4_,local_2b8.data._0_4_) != (void *)0x0) {
              free((void *)CONCAT44(local_2b8.data._4_4_,local_2b8.data._0_4_));
            }
          }
          else {
            (*(local_2b8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_2b8.cstep = 0;
      local_2b8.data._0_4_ = 0;
      local_2b8.data._4_4_ = 0;
      local_2b8.refcount._0_4_ = 0;
      local_2b8.refcount._4_4_ = 0;
      local_2b8.elemsize = 0;
      local_2b8.elempack = 0;
      local_2b8.dims = 0;
      local_2b8.w = 0;
      local_2b8.h = 0;
      local_2b8.d = 0;
      local_2b8.c = 0;
      piVar15 = (int *)CONCAT44(fStack_20c,local_210);
      if (piVar15 != (int *)0x0) {
        LOCK();
        *piVar15 = *piVar15 + -1;
        UNLOCK();
        if (*piVar15 == 0) {
          if (local_1f8 == (Allocator *)0x0) {
            if (_image != (void *)0x0) {
              free(_image);
            }
          }
          else {
            (*local_1f8->_vptr_Allocator[3])();
          }
        }
      }
      ncnn::Net::~Net(&nanodet);
      cv::Mat::clone();
      psVar17 = (size_t *)CONCAT44(local_2b8.data._4_4_,local_2b8.data._0_4_);
      if (objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start) {
        lVar22 = 0;
        uVar26 = 0;
        pOVar28 = objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                  super__Vector_impl_data._M_start;
        do {
          local_2b8.data = psVar17;
          fprintf(_stderr,"%d = %.5f at %.2f %.2f %.2f x %.2f\n",
                  (double)*(float *)((long)&pOVar28->prob + lVar22),
                  (double)*(float *)((long)&(pOVar28->rect).x + lVar22),
                  (double)*(float *)((long)&(pOVar28->rect).y + lVar22),
                  (double)*(float *)((long)&(pOVar28->rect).width + lVar22),
                  (double)*(float *)((long)&(pOVar28->rect).height + lVar22),
                  (ulong)*(uint *)((long)&pOVar28->label + lVar22));
          local_2b8.elemsize = 0;
          local_2b8.data._0_4_ = 0x3010000;
          objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start._4_4_ =
               (int)ROUND(*(float *)((long)&(pOVar28->rect).y + lVar22));
          objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start._0_4_ =
               (int)ROUND(*(float *)((long)&(pOVar28->rect).x + lVar22));
          objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_finish._0_4_ =
               (int)ROUND(*(float *)((long)&(pOVar28->rect).width + lVar22));
          objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_finish._4_4_ =
               (int)ROUND(*(float *)((long)&(pOVar28->rect).height + lVar22));
          nanodet._vptr_Net = (_func_int **)0x406fe00000000000;
          nanodet.opt.lightmode = false;
          nanodet.opt._1_3_ = 0;
          nanodet.opt.num_threads = 0;
          nanodet.opt.blob_allocator = (Allocator *)0x0;
          nanodet.opt.workspace_allocator = (Allocator *)0x0;
          local_2b8.refcount = (int *)&image;
          cv::rectangle(&local_2b8,&objects8,&nanodet,1,8,0);
          sprintf((char *)&nanodet,"%s %.1f%%",
                  (double)(*(float *)((long)&pOVar28->prob + lVar22) * 100.0),
                  _ZZL12draw_objectsRKN2cv3MatERKSt6vectorI6ObjectSaIS4_EEE11class_names_rel +
                  *(int *)(
                          _ZZL12draw_objectsRKN2cv3MatERKSt6vectorI6ObjectSaIS4_EEE11class_names_rel
                          + (long)*(int *)((long)&pOVar28->label + lVar22) * 4));
          baseLine = 0;
          local_2b8.data = &local_2b8.elemsize;
          sVar23 = strlen((char *)&nanodet);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_2b8,&nanodet,(long)&nanodet._vptr_Net + sVar23);
          cv::getTextSize((string *)mean_vals,(int)&local_2b8,0.5,0,(int *)0x1);
          if ((size_t *)local_2b8.data != &local_2b8.elemsize) {
            operator_delete(local_2b8.data);
          }
          fVar35 = (float)(int)*(float *)((long)&(pOVar28->rect).x + lVar22);
          iVar19 = (int)((*(float *)((long)&(pOVar28->rect).y + lVar22) - (float)(int)mean_vals[1])
                        - (float)baseLine);
          if (iVar19 < 1) {
            iVar19 = 0;
          }
          fVar36 = (float)((int)fStack_20c - (int)mean_vals[0]);
          if ((int)mean_vals[0] + (int)fVar35 <= (int)fStack_20c) {
            fVar36 = fVar35;
          }
          proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start._0_4_ = 0x3010000;
          proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)&image;
          ex.d._4_4_ = baseLine + (int)mean_vals[1];
          ex.d._0_4_ = mean_vals[0];
          local_2b8.data._0_4_ = 0;
          local_2b8.data._4_4_ = 0x406fe000;
          local_2b8.refcount._0_4_ = 0;
          local_2b8.refcount._4_4_ = 0x406fe000;
          local_2b8.elemsize = 0x406fe00000000000;
          local_2b8.elempack = 0;
          local_2b8._28_4_ = 0;
          ex._vptr_Extractor._0_4_ = fVar36;
          ex._vptr_Extractor._4_4_ = iVar19;
          cv::rectangle(&proposals,&ex,&local_2b8,0xffffffff,8,0);
          proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start._0_4_ = 0x3010000;
          proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)&image;
          local_2b8.data = &local_2b8.elemsize;
          sVar23 = strlen((char *)&nanodet);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_2b8,&nanodet,(long)&nanodet._vptr_Net + sVar23);
          norm_vals[1] = (float)(iVar19 + (int)mean_vals[1]);
          norm_vals[0] = fVar36;
          areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_finish._0_4_ = 0;
          areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_finish._4_4_ = 0;
          areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          cv::putText(0x3fe0000000000000,&proposals,&local_2b8,norm_vals,0,&areas,1,8,0);
          psVar17 = (size_t *)local_2b8.data;
          if ((size_t *)local_2b8.data != &local_2b8.elemsize) {
            operator_delete(local_2b8.data);
            psVar17 = (size_t *)local_2b8.data;
          }
          local_2b8.data._4_4_ = (undefined4)((ulong)psVar17 >> 0x20);
          uVar26 = uVar26 + 1;
          lVar22 = lVar22 + 0x18;
          pOVar28 = objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                    super__Vector_impl_data._M_start;
        } while (uVar26 < (ulong)(((long)objects.super__Vector_base<Object,_std::allocator<Object>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)objects.super__Vector_base<Object,_std::allocator<Object>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                 -0x5555555555555555));
      }
      local_2b8.refcount = (int *)&image;
      ppAVar3 = &nanodet.opt.blob_allocator;
      nanodet.opt.blob_allocator =
           (Allocator *)CONCAT26(nanodet.opt.blob_allocator._6_2_,0x6567616d69);
      nanodet.opt.lightmode = true;
      nanodet.opt._1_3_ = 0;
      nanodet.opt.num_threads = 0;
      local_2b8.elemsize = 0;
      local_2b8.data._0_4_ = 0x1010000;
      nanodet._vptr_Net = (_func_int **)ppAVar3;
      cv::imshow((string *)&nanodet,(_InputArray *)&local_2b8);
      if ((Allocator **)nanodet._vptr_Net != ppAVar3) {
        operator_delete(nanodet._vptr_Net);
      }
      cv::waitKey(0);
      cv::Mat::~Mat(&image);
      if (objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      iVar19 = 0;
    }
    else {
      fprintf(_stderr,"cv::imread %s failed\n",pcVar12);
      iVar19 = -1;
    }
    cv::Mat::~Mat(&m);
  }
  else {
    main_cold_1();
    iVar19 = -1;
  }
  return iVar19;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc != 2)
    {
        fprintf(stderr, "Usage: %s [imagepath]\n", argv[0]);
        return -1;
    }

    const char* imagepath = argv[1];

    cv::Mat m = cv::imread(imagepath, 1);
    if (m.empty())
    {
        fprintf(stderr, "cv::imread %s failed\n", imagepath);
        return -1;
    }

    std::vector<Object> objects;
    detect_nanodet(m, objects);

    draw_objects(m, objects);

    return 0;
}